

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

void __thiscall QHeaderView::initializeSections(QHeaderView *this,int start,int end)

{
  QHash<int,_int> *this_00;
  QList<int> *this_01;
  uint _t1;
  ResizeMode mode;
  QHeaderViewPrivate *this_02;
  Data *pDVar1;
  size_t sVar2;
  Span *pSVar3;
  int start_00;
  int iVar4;
  pointer piVar5;
  int iVar6;
  uint _t2;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long in_FS_OFFSET;
  piter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  (this_02->cachedSizeHint).wd = -1;
  (this_02->cachedSizeHint).ht = -1;
  if (this_02->headerMode == InitialNoSectionMemoryUsage) {
    _t1 = (uint)this_02->countInNoSectionItemsMode;
  }
  else {
    _t1 = (uint)(this_02->sectionItems).d.size;
  }
  start_00 = end + 1;
  if (start_00 < (int)_t1) {
    QHeaderViewPrivate::removeSectionsFromSectionItems(this_02,start_00,_t1 - 1);
    pDVar1 = (this_02->hiddenSectionSize).d;
    if ((pDVar1 != (Data *)0x0) && (sVar2 = pDVar1->size, sVar2 != 0)) {
      this_00 = &this_02->hiddenSectionSize;
      if ((long)sVar2 < (long)(int)(_t1 - start_00)) {
        iVar4 = start_00;
        while( true ) {
          local_48.d._0_4_ = iVar4;
          if (this_02->headerMode == InitialNoSectionMemoryUsage) {
            iVar6 = (int)this_02->countInNoSectionItemsMode;
          }
          else {
            iVar6 = (int)(this_02->sectionItems).d.size;
          }
          if (iVar6 <= iVar4) break;
          QHash<int,_int>::removeImpl<int>(this_00,(int *)&local_48);
          iVar4 = (int)local_48.d + 1;
        }
      }
      else {
        local_48 = (piter)QHash<int,_int>::begin(this_00);
        while( true ) {
          if ((local_48.d == (Data<QHashPrivate::Node<int,_int>_> *)0x0) && (local_48.bucket == 0))
          break;
          pSVar3 = (local_48.d)->spans;
          uVar7 = local_48.bucket >> 7;
          if (end < *(int *)pSVar3[uVar7].entries
                            [pSVar3[uVar7].offsets[(uint)local_48.bucket & 0x7f]].storage.data) {
            local_48 = (piter)QHash<int,_int>::erase(this_00,(const_iterator)local_48);
          }
          else {
            QHashPrivate::iterator<QHashPrivate::Node<int,_int>_>::operator++(&local_48);
          }
        }
      }
    }
  }
  if ((this_02->logicalIndices).d.size != 0) {
    this_01 = &this_02->logicalIndices;
    if (start_00 < (int)_t1) {
      uVar8 = 0;
      uVar7 = 0;
      if (0 < (int)_t1) {
        uVar7 = (ulong)_t1;
      }
      iVar4 = 0;
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        iVar6 = (this_02->logicalIndices).d.ptr[uVar8];
        if (iVar6 <= end) {
          piVar5 = QList<int>::data(this_01);
          piVar5[iVar4] = iVar6;
          piVar5 = QList<int>::data(&this_02->visualIndices);
          piVar5[iVar6] = iVar4;
          iVar4 = iVar4 + 1;
        }
      }
      QList<int>::resize(this_01,(long)start_00);
      QList<int>::resize(&this_02->visualIndices,(long)start_00);
    }
    else {
      QList<int>::resize(this_01,(long)start_00);
      QList<int>::resize(&this_02->visualIndices,(long)start_00);
      for (lVar9 = (long)(int)_t1; lVar9 <= end; lVar9 = lVar9 + 1) {
        piVar5 = QList<int>::data(this_01);
        piVar5[lVar9] = (int)lVar9;
        piVar5 = QList<int>::data(&this_02->visualIndices);
        piVar5[lVar9] = (int)lVar9;
      }
    }
  }
  mode = this_02->globalResizeMode;
  if (mode == ResizeToContents) {
    this_02->contentsSections = start_00;
  }
  else if (mode == Stretch) {
    this_02->stretchSections = start_00;
  }
  if ((int)_t1 <= end) {
    QHeaderViewPrivate::createSectionItems(this_02,start,end,this_02->defaultSectionSize,mode);
  }
  if (this_02->headerMode == InitialNoSectionMemoryUsage) {
    _t2 = (uint)this_02->countInNoSectionItemsMode;
  }
  else {
    _t2 = (uint)(this_02->sectionItems).d.size;
  }
  if (_t1 != _t2) {
    sectionCountChanged(this,_t1,_t2);
  }
  QWidget::update((this_02->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  viewport);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::initializeSections(int start, int end)
{
    Q_D(QHeaderView);

    Q_ASSERT(start >= 0);
    Q_ASSERT(end >= 0);

    d->invalidateCachedSizeHint();
    int oldCount = d->sectionCount();

    if (end + 1 < d->sectionCount()) {
        int newCount = end + 1;
        d->removeSectionsFromSectionItems(newCount, d->sectionCount() - 1);
        if (!d->hiddenSectionSize.isEmpty()) {
            if (oldCount - newCount > d->hiddenSectionSize.size()) {
                for (int i = end + 1; i < d->sectionCount(); ++i)
                    d->hiddenSectionSize.remove(i);
            } else {
                QHash<int, int>::iterator it = d->hiddenSectionSize.begin();
                while (it != d->hiddenSectionSize.end()) {
                    if (it.key() > end)
                        it = d->hiddenSectionSize.erase(it);
                    else
                        ++it;
                }
            }
        }
    }

    int newSectionCount = end + 1;

    if (!d->logicalIndices.isEmpty()) {
        if (oldCount <= newSectionCount) {
            d->logicalIndices.resize(newSectionCount);
            d->visualIndices.resize(newSectionCount);
            for (int i = oldCount; i < newSectionCount; ++i) {
                d->logicalIndices[i] = i;
                d->visualIndices[i] = i;
            }
        } else {
            int j = 0;
            for (int i = 0; i < oldCount; ++i) {
                int v = d->logicalIndices.at(i);
                if (v < newSectionCount) {
                    d->logicalIndices[j] = v;
                    d->visualIndices[v] = j;
                    j++;
                }
            }
            d->logicalIndices.resize(newSectionCount);
            d->visualIndices.resize(newSectionCount);
        }
    }

    if (d->globalResizeMode == Stretch)
        d->stretchSections = newSectionCount;
    else if (d->globalResizeMode == ResizeToContents)
         d->contentsSections = newSectionCount;

    if (newSectionCount > oldCount)
        d->createSectionItems(start, end, d->defaultSectionSize, d->globalResizeMode);
    //Q_ASSERT(d->headerLength() == d->length);

    if (d->sectionCount() != oldCount)
        emit sectionCountChanged(oldCount,  d->sectionCount());
    d->viewport->update();
}